

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_offsetof(lua_State *L)

{
  global_State *pgVar1;
  CTypeID id_00;
  CTState *cts_00;
  GCstr *ofs_00;
  CType *pCVar2;
  CTState *in_RDI;
  CType *fct;
  CTSize ofs;
  CType *ct;
  GCstr *name;
  CTState *in_stack_00000020;
  CTypeID id;
  CTState *cts;
  CTState *cts_1;
  int local_6c;
  undefined8 in_stack_ffffffffffffff98;
  int narg;
  lua_State *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  
  narg = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  cts_00 = (CTState *)(ulong)*(uint *)((ulong)((MRef *)&in_RDI->top)->ptr32 + 0xfc);
  cts_00->L = (lua_State *)in_RDI;
  id_00 = ffi_checkctype((lua_State *)cts,in_stack_00000020,(TValue *)name);
  ofs_00 = lj_lib_checkstr(in_stack_ffffffffffffffa0,narg);
  pCVar2 = lj_ctype_rawref(cts_00,id_00);
  if (((pCVar2->info >> 0x1c == 1) && (pCVar2->size != 0xffffffff)) &&
     (pCVar2 = lj_ctype_getfieldq(in_RDI,(CType *)cts_00,
                                  (GCstr *)CONCAT44(id_00,in_stack_ffffffffffffffa8),
                                  (CTSize *)ofs_00,&pCVar2->info), pCVar2 != (CType *)0x0)) {
    *(double *)(in_RDI->g[-1].gcroot + 0x24) = (double)local_6c;
    if (pCVar2->info >> 0x1c == 9) {
      return 1;
    }
    if (pCVar2->info >> 0x1c == 10) {
      pgVar1 = in_RDI->g;
      in_RDI->g = (global_State *)&pgVar1->strmask;
      pgVar1->strhash = (GCRef *)(double)(pCVar2->info & 0x7f);
      pgVar1 = in_RDI->g;
      in_RDI->g = (global_State *)&pgVar1->strmask;
      pgVar1->strhash = (GCRef *)(double)(pCVar2->info >> 8 & 0x7f);
      return 3;
    }
  }
  return 0;
}

Assistant:

LJLIB_CF(ffi_offsetof)	LJLIB_REC(ffi_xof FF_ffi_offsetof)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  GCstr *name = lj_lib_checkstr(L, 2);
  CType *ct = lj_ctype_rawref(cts, id);
  CTSize ofs;
  if (ctype_isstruct(ct->info) && ct->size != CTSIZE_INVALID) {
    CType *fct = lj_ctype_getfield(cts, ct, name, &ofs);
    if (fct) {
      setintV(L->top-1, ofs);
      if (ctype_isfield(fct->info)) {
	return 1;
      } else if (ctype_isbitfield(fct->info)) {
	setintV(L->top++, ctype_bitpos(fct->info));
	setintV(L->top++, ctype_bitbsz(fct->info));
	return 3;
      }
    }
  }
  return 0;
}